

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.h
# Opt level: O2

void __thiscall pbrt::TexInfo::~TexInfo(TexInfo *this)

{
  std::__cxx11::string::~string((string *)&this->filter);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

TexInfo(const std::string &f, const std::string &filt, Float ma, WrapMode wm,
            ColorEncodingHandle encoding)
        : filename(f), filter(filt), maxAniso(ma), wrapMode(wm), encoding(encoding) {}